

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O0

optional<tinyusdz::Animatable<std::array<float,_2UL>_>_> * __thiscall
tinyusdz::prim::(anonymous_namespace)::ConvertToAnimatable<std::array<float,2ul>>
          (optional<tinyusdz::Animatable<std::array<float,_2UL>_>_> *__return_storage_ptr__,
          _anonymous_namespace_ *this,PrimVar *var)

{
  double t;
  bool bVar1;
  TimeSamples *pTVar2;
  Sample *pSVar3;
  vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  *this_00;
  value_type *pvVar4;
  optional<std::array<float,_2UL>_> local_98;
  undefined1 local_8c [8];
  optional<std::array<float,_2UL>_> pv_1;
  Sample *s;
  size_t i;
  undefined1 local_60 [8];
  optional<std::array<float,_2UL>_> pv;
  bool ok;
  undefined1 local_48 [8];
  Animatable<std::array<float,_2UL>_> dst;
  PrimVar *var_local;
  
  dst._ts._24_8_ = this;
  Animatable<std::array<float,_2UL>_>::Animatable((Animatable<std::array<float,_2UL>_> *)local_48);
  bVar1 = primvar::PrimVar::is_valid((PrimVar *)dst._ts._24_8_);
  if (bVar1) {
    pv.contained._3_1_ = 0;
    bVar1 = primvar::PrimVar::has_value((PrimVar *)dst._ts._24_8_);
    if (bVar1) {
      primvar::PrimVar::get_value<std::array<float,2ul>>
                ((optional<std::array<float,_2UL>_> *)((long)&i + 4),(PrimVar *)dst._ts._24_8_);
      nonstd::optional_lite::optional<std::array<float,_2UL>_>::optional<std::array<float,_2UL>,_0>
                ((optional<std::array<float,_2UL>_> *)local_60,
                 (optional<std::array<float,_2UL>_> *)((long)&i + 4));
      nonstd::optional_lite::optional<std::array<float,_2UL>_>::~optional
                ((optional<std::array<float,_2UL>_> *)((long)&i + 4));
      bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_60);
      if (bVar1) {
        pvVar4 = nonstd::optional_lite::optional<std::array<float,_2UL>_>::value
                           ((optional<std::array<float,_2UL>_> *)local_60);
        Animatable<std::array<float,_2UL>_>::set_default
                  ((Animatable<std::array<float,_2UL>_> *)local_48,pvVar4);
        pv.contained._3_1_ = 1;
      }
      nonstd::optional_lite::optional<std::array<float,_2UL>_>::~optional
                ((optional<std::array<float,_2UL>_> *)local_60);
    }
    bVar1 = primvar::PrimVar::has_timesamples((PrimVar *)dst._ts._24_8_);
    if (bVar1) {
      s = (Sample *)0x0;
      while( true ) {
        pTVar2 = primvar::PrimVar::ts_raw((PrimVar *)dst._ts._24_8_);
        pSVar3 = (Sample *)tinyusdz::value::TimeSamples::size(pTVar2);
        if (pSVar3 <= s) break;
        pTVar2 = primvar::PrimVar::ts_raw((PrimVar *)dst._ts._24_8_);
        this_00 = tinyusdz::value::TimeSamples::get_samples(pTVar2);
        pv_1.contained =
             (storage_t<std::array<float,_2UL>_>)
             ::std::
             vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
             ::operator[]((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                           *)this_00,(size_type)s);
        if ((*(bool *)((long)pv_1.contained + 0x20) & 1U) == 0) {
          tinyusdz::value::Value::get_value<std::array<float,2ul>>
                    (&local_98,(Value *)((long)pv_1.contained + 8),false);
          nonstd::optional_lite::optional<std::array<float,_2UL>_>::
          optional<std::array<float,_2UL>,_0>
                    ((optional<std::array<float,_2UL>_> *)local_8c,&local_98);
          nonstd::optional_lite::optional<std::array<float,_2UL>_>::~optional(&local_98);
          bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_8c);
          if (bVar1) {
            t = *(double *)pv_1.contained;
            pvVar4 = nonstd::optional_lite::optional<std::array<float,_2UL>_>::value
                               ((optional<std::array<float,_2UL>_> *)local_8c);
            Animatable<std::array<float,_2UL>_>::add_sample
                      ((Animatable<std::array<float,_2UL>_> *)local_48,t,pvVar4);
          }
          else {
            nonstd::optional_lite::optional<tinyusdz::Animatable<std::array<float,_2UL>_>_>::
            optional(__return_storage_ptr__);
          }
          pv.contained._5_3_ = 0;
          pv.contained._4_1_ = !bVar1;
          nonstd::optional_lite::optional<std::array<float,_2UL>_>::~optional
                    ((optional<std::array<float,_2UL>_> *)local_8c);
          if (pv.contained._4_4_ != 0) goto LAB_002dd388;
        }
        else {
          Animatable<std::array<float,_2UL>_>::add_blocked_sample
                    ((Animatable<std::array<float,_2UL>_> *)local_48,*(double *)pv_1.contained);
        }
        s = (Sample *)((long)&s->t + 1);
      }
      pv.contained._3_1_ = 1;
    }
    if ((pv.contained._3_1_ & 1) == 0) {
      nonstd::optional_lite::optional<tinyusdz::Animatable<std::array<float,_2UL>_>_>::optional
                (__return_storage_ptr__);
      pv.contained._4_4_ = 1;
    }
    else {
      nonstd::optional_lite::optional<tinyusdz::Animatable<std::array<float,_2UL>_>_>::
      optional<tinyusdz::Animatable<std::array<float,_2UL>_>,_0>
                (__return_storage_ptr__,(Animatable<std::array<float,_2UL>_> *)local_48);
      pv.contained._4_4_ = 1;
    }
  }
  else {
    nonstd::optional_lite::optional<tinyusdz::Animatable<std::array<float,_2UL>_>_>::optional
              (__return_storage_ptr__);
    pv.contained._4_4_ = 1;
  }
LAB_002dd388:
  Animatable<std::array<float,_2UL>_>::~Animatable((Animatable<std::array<float,_2UL>_> *)local_48);
  return __return_storage_ptr__;
}

Assistant:

static nonstd::optional<Animatable<T>> ConvertToAnimatable(const primvar::PrimVar &var)
{
  Animatable<T> dst;

  if (!var.is_valid()) {
    DCOUT("is_valid failed");
    DCOUT("has_value " << var.has_value());
    DCOUT("has_timesamples " << var.has_timesamples());
    return nonstd::nullopt;
  }

  bool ok = false;

  if (var.has_value()) {

    if (auto pv = var.get_value<T>()) {
      dst.set_default(pv.value());

      ok = true;
      //return std::move(dst);
    }
  }

  if (var.has_timesamples()) {
    for (size_t i = 0; i < var.ts_raw().size(); i++) {
      const value::TimeSamples::Sample &s = var.ts_raw().get_samples()[i];

      // Attribute Block?
      if (s.blocked) {
        dst.add_blocked_sample(s.t);
      } else if (auto pv = s.value.get_value<T>()) {
        dst.add_sample(s.t, pv.value());
      } else {
        // Type mismatch
        DCOUT(i << "/" << var.ts_raw().size() << " type mismatch.");
        return nonstd::nullopt;
      }
    }

    ok = true;
  }

  if (ok) {
    return std::move(dst);
  }

  DCOUT("???");
  return nonstd::nullopt;
}